

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void singlevar(LexState *ls,expdesc *var)

{
  FuncState *fs;
  TString *n;
  expdesc key;
  
  n = str_checkname(ls);
  fs = ls->fs;
  singlevaraux(fs,n,var,1);
  if (var->k == VVOID) {
    singlevaraux(fs,ls->envn,var,1);
    key.u.info = luaK_stringK(ls->fs,n);
    key.t = -1;
    key.f = -1;
    key.k = VK;
    luaK_indexed(fs,var,&key);
  }
  return;
}

Assistant:

static void singlevar(LexState *ls, expdesc *var) {
    TString *varname = str_checkname(ls);
    FuncState *fs = ls->fs;
    singlevaraux(fs, varname, var, 1);
    if (var->k == VVOID) {  /* global name? */
        expdesc key;
        singlevaraux(fs, ls->envn, var, 1);  /* get environment variable */
        lua_assert(var->k != VVOID);  /* this one must exist */
        codestring(ls, &key, varname);  /* key is variable name */
        luaK_indexed(fs, var, &key);  /* env[varname] */
    }
}